

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp6.c
# Opt level: O1

void outdefines(Global *global)

{
  byte bVar1;
  ulong uVar2;
  ushort **ppuVar3;
  char *__s;
  int number;
  uint c;
  byte *pbVar4;
  undefined8 *puVar5;
  bool bVar6;
  char local_58 [40];
  
  deldefines(global);
  uVar2 = 0x958;
  do {
    for (puVar5 = *(undefined8 **)(global->work + (uVar2 - 0x40)); puVar5 != (undefined8 *)0x0;
        puVar5 = (undefined8 *)*puVar5) {
      Putstring(global,"#define ");
      Putstring(global,(char *)((long)puVar5 + 0x1c));
      if (*(int *)(puVar5 + 3) < 1) {
        if (*(int *)(puVar5 + 3) == 0) {
          Putstring(global,"()");
        }
      }
      else {
        Putchar(global,0x28);
        number = 1;
        if (1 < *(int *)(puVar5 + 3)) {
          do {
            Putstring(global,"__");
            Putint(global,number);
            Putchar(global,0x2c);
            number = number + 1;
          } while (number < *(int *)(puVar5 + 3));
        }
        Putstring(global,"__");
        Putint(global,number);
        Putchar(global,0x29);
      }
      if (puVar5[1] != 0) {
        Putchar(global,9);
        pbVar4 = (byte *)puVar5[1];
        bVar1 = *pbVar4;
        while (bVar1 != 0) {
          pbVar4 = pbVar4 + 1;
          if ((byte)(bVar1 + 0x81) < 0x20) {
            Putstring(global,"__");
            Putint(global,bVar1 - 0x7e);
            goto switchD_00106b7a_caseD_1d;
          }
          ppuVar3 = __ctype_b_loc();
          c = (uint)bVar1;
          if (((byte)(bVar1 - 9) < 2) || (((*ppuVar3)[c] & 0x4000) != 0)) goto LAB_00106b8c;
          switch(bVar1) {
          case 0x1c:
            c = 0x23;
            goto LAB_00106b8c;
          case 0x1d:
            break;
          case 0x1e:
            __s = "##";
LAB_00106bd7:
            Putstring(global,__s);
            break;
          case 0x1f:
            c = 0x20;
LAB_00106b8c:
            Putchar(global,c);
            break;
          default:
            if (c != 0x9f) {
              __s = local_58;
              sprintf(__s,"\\0%o",(ulong)c);
              goto LAB_00106bd7;
            }
          }
switchD_00106b7a_caseD_1d:
          bVar1 = *pbVar4;
        }
      }
      Putchar(global,10);
    }
    bVar6 = 0xb4f < uVar2;
    uVar2 = uVar2 + 8;
    if (bVar6) {
      return;
    }
  } while( true );
}

Assistant:

void outdefines(struct Global *global)
{
  DEFBUF *dp;
  DEFBUF **syp;
  
  deldefines(global);                   /* Delete built-in #defines     */
  for (syp = global->symtab; syp < &global->symtab[SBSIZE]; syp++) {
    if ((dp = *syp) != (DEFBUF *) NULL) {
      do {
	outadefine(global, dp);
      } while ((dp = dp->link) != (DEFBUF *) NULL);
    }
  }
}